

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTcPrsNode * __thiscall
CTPNStmDoWhileBase::fold_constants(CTPNStmDoWhileBase *this,CTcPrsSymtab *symtab)

{
  CTcTokenizer *this_00;
  CTcTokFileDesc *desc;
  long lVar1;
  _func_int **pp_Var2;
  undefined8 in_RSI;
  CTPNStmBase *in_RDI;
  
  this_00 = G_tok;
  desc = CTPNStmBase::get_source_desc(in_RDI);
  lVar1 = CTPNStmBase::get_source_linenum(in_RDI);
  CTcTokenizer::set_line_info(this_00,desc,lVar1);
  if (in_RDI[1].linenum_ != 0) {
    lVar1 = (**(code **)(*(long *)in_RDI[1].linenum_ + 0x78))((long *)in_RDI[1].linenum_,in_RSI);
    in_RDI[1].linenum_ = lVar1;
  }
  if (in_RDI[2].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase != (_func_int **)0x0) {
    pp_Var2 = in_RDI[2].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
    pp_Var2 = (_func_int **)(**(code **)(*pp_Var2 + 0x78))(pp_Var2,in_RSI);
    in_RDI[2].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var2;
  }
  return &in_RDI->super_CTcPrsNode;
}

Assistant:

CTcPrsNode *CTPNStmDoWhileBase::fold_constants(CTcPrsSymtab *symtab)
{
    /* set our location for any errors that occur */
    G_tok->set_line_info(get_source_desc(), get_source_linenum());

    /* 
     *   fold constants in our condition expression, replacing the
     *   expression with the folded version 
     */
    if (cond_expr_ != 0)
        cond_expr_ = cond_expr_->fold_constants(symtab);

    /* fold constants in the body statement */
    if (body_stm_ != 0)
        body_stm_ = (CTPNStm *)body_stm_->fold_constants(symtab);

    /* we are not directly changed by this operation */
    return this;
}